

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

long BIO_callback_ctrl(BIO *b,int cmd,fp *fp)

{
  BIO_info_cb *fp_local;
  int cmd_local;
  BIO *bio_local;
  
  if (b == (BIO *)0x0) {
    bio_local = (BIO *)0x0;
  }
  else if ((b->method == (BIO_METHOD *)0x0) || (b->method->callback_ctrl == (_func_602 *)0x0)) {
    ERR_put_error(0x11,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0xfd);
    bio_local = (BIO *)0x0;
  }
  else {
    bio_local = (BIO *)(*b->method->callback_ctrl)(b,cmd,fp);
  }
  return (long)bio_local;
}

Assistant:

long BIO_callback_ctrl(BIO *bio, int cmd, BIO_info_cb *fp) {
  if (bio == NULL) {
    return 0;
  }

  if (bio->method == NULL || bio->method->callback_ctrl == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return 0;
  }

  return bio->method->callback_ctrl(bio, cmd, fp);
}